

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::qstring_trait_t>::start_tag_parsing
          (parser_conffile_impl_t<cfgfile::qstring_trait_t> *this,
          tag_t<cfgfile::qstring_trait_t> *parent,child_tags_list_t *list)

{
  pointer pptVar1;
  bool bVar2;
  exception_t<cfgfile::qstring_trait_t> *this_00;
  pointer pptVar3;
  allocator<char> local_245;
  allocator<char> local_244;
  allocator<char> local_243;
  allocator<char> local_242;
  allocator<char> local_241;
  string_t local_240;
  string_t local_228;
  string_t local_210;
  string_t local_1f8;
  string_t local_1e0;
  string_t local_1c8;
  qstring_wrapper_t local_1b0;
  qstring_wrapper_t local_198;
  qstring_wrapper_t local_180;
  qstring_wrapper_t local_168;
  qstring_wrapper_t local_150;
  qstring_wrapper_t local_138;
  qstring_wrapper_t local_120;
  qstring_wrapper_t local_108;
  lexeme_t<cfgfile::qstring_trait_t> lexeme;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  lexical_analyzer_t<cfgfile::qstring_trait_t>::next_lexeme(&lexeme,&this->m_lex);
  pptVar3 = (list->
            super__Vector_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pptVar1 = (list->
            super__Vector_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pptVar3 == pptVar1) {
      this_00 = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Unexpected tag name. We expected one child tag of tag \"",
                 &local_241);
      qstring_trait_t::from_ascii(&local_1c8,&local_50);
      operator+(&local_1b0,&local_1c8,&parent->m_name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"\", but we\'ve got \"",&local_242);
      qstring_trait_t::from_ascii(&local_1e0,&local_70);
      operator+(&local_198,&local_1b0,&local_1e0);
      operator+(&local_180,&local_198,&lexeme.m_value);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"\". In file \"",&local_243);
      qstring_trait_t::from_ascii(&local_1f8,&local_90);
      operator+(&local_168,&local_180,&local_1f8);
      operator+(&local_150,&local_168,&((this->m_lex).m_stream)->m_file_name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"\" on line ",&local_244);
      qstring_trait_t::from_ascii(&local_210,&local_b0);
      operator+(&local_138,&local_150,&local_210);
      qstring_trait_t::to_string(&local_228,(this->m_lex).m_line_number);
      operator+(&local_120,&local_138,&local_228);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,".",&local_245);
      qstring_trait_t::from_ascii(&local_240,&local_d0);
      operator+(&local_108,&local_120,&local_240);
      exception_t<cfgfile::qstring_trait_t>::exception_t(this_00,&local_108);
      __cxa_throw(this_00,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                  exception_t<cfgfile::qstring_trait_t>::~exception_t);
    }
    bVar2 = start_tag_parsing(this,&lexeme,*pptVar3);
    pptVar3 = pptVar3 + 1;
  } while (!bVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&lexeme.m_value);
  return;
}

Assistant:

void start_tag_parsing( const tag_t< Trait > & parent,
		const typename tag_t< Trait >::child_tags_list_t & list )
	{
		lexeme_t< Trait > lexeme = m_lex.next_lexeme();

		bool tag_found = false;

		for( tag_t< Trait > * tag : list )
		{
			if( start_tag_parsing( lexeme, *tag ) )
			{
				tag_found = true;

				break;
			}
		}

		if( !tag_found )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected tag name. "
					"We expected one child tag of tag \"" ) +
				parent.name() +
				Trait::from_ascii( "\", but we've got \"" ) + lexeme.value() +
				Trait::from_ascii( "\". In file \"" ) +
				m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
	}